

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canlogserver.c
# Opt level: O1

void print_usage(char *prg)

{
  fprintf(_stderr,"\nUsage: %s [options] <CAN interface>+\n",prg);
  fprintf(_stderr,"  (use CTRL-C to terminate %s)\n\n",prg);
  fwrite("Options:\n",9,1,_stderr);
  fwrite("         -m <mask>   (ID filter mask.  Default 0x00000000) *\n",0x3d,1,_stderr);
  fwrite("         -v <value>  (ID filter value. Default 0x00000000) *\n",0x3d,1,_stderr);
  fwrite("         -i <0|1>    (invert the specified ID filter) *\n",0x38,1,_stderr);
  fwrite("         -e <emask>  (mask for error frames)\n",0x2d,1,_stderr);
  fprintf(_stderr,"         -p <port>   (listen on port <port>. Default: %d)\n",0x701c);
  fputc(10,_stderr);
  fwrite("* The CAN ID filter matches, when ...\n",0x26,1,_stderr);
  fwrite("       <received_can_id> & mask == value & mask\n",0x30,1,_stderr);
  fputc(10,_stderr);
  fwrite("When using more than one CAN interface the options\n",0x33,1,_stderr);
  fwrite("m/v/i/e have comma separated values e.g. \'-m 0,7FF,0\'\n",0x36,1,_stderr);
  fprintf(_stderr,"\nUse interface name \'%s\' to receive from all CAN interfaces.\n\n","any");
  return;
}

Assistant:

void print_usage(char *prg)
{
	fprintf(stderr, "\nUsage: %s [options] <CAN interface>+\n", prg);
	fprintf(stderr, "  (use CTRL-C to terminate %s)\n\n", prg);
	fprintf(stderr, "Options:\n");
	fprintf(stderr, "         -m <mask>   (ID filter mask.  Default 0x00000000) *\n");
	fprintf(stderr, "         -v <value>  (ID filter value. Default 0x00000000) *\n");
	fprintf(stderr, "         -i <0|1>    (invert the specified ID filter) *\n");
	fprintf(stderr, "         -e <emask>  (mask for error frames)\n");
	fprintf(stderr, "         -p <port>   (listen on port <port>. Default: %d)\n", DEFPORT);
	fprintf(stderr, "\n");
	fprintf(stderr, "* The CAN ID filter matches, when ...\n");
	fprintf(stderr, "       <received_can_id> & mask == value & mask\n");
	fprintf(stderr, "\n");
	fprintf(stderr, "When using more than one CAN interface the options\n");
	fprintf(stderr, "m/v/i/e have comma separated values e.g. '-m 0,7FF,0'\n");
	fprintf(stderr, "\nUse interface name '%s' to receive from all CAN interfaces.\n\n", ANYDEV);
}